

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

xmlParserInputPtr xmlSAX2ResolveEntity(void *ctx,xmlChar *publicId,xmlChar *systemId)

{
  int iVar1;
  xmlChar *pxStack_48;
  int res;
  xmlChar *base;
  xmlChar *URI;
  xmlParserInputPtr ret;
  xmlParserCtxtPtr ctxt;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  void *ctx_local;
  
  URI = (xmlChar *)0x0;
  base = (xmlChar *)0x0;
  if (ctx == (void *)0x0) {
    return (xmlParserInputPtr)0x0;
  }
  ret = (xmlParserInputPtr)ctx;
  ctxt = (xmlParserCtxtPtr)systemId;
  systemId_local = publicId;
  publicId_local = (xmlChar *)ctx;
  if (systemId != (xmlChar *)0x0) {
    pxStack_48 = (xmlChar *)0x0;
    if (*(long *)((long)ctx + 0x38) != 0) {
      pxStack_48 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8);
    }
    if (pxStack_48 == (xmlChar *)0x0) {
      pxStack_48 = *(xmlChar **)((long)ctx + 0x118);
    }
    iVar1 = xmlStrlen(systemId);
    if ((2000 < iVar1) || (iVar1 = xmlStrlen(pxStack_48), 2000 < iVar1)) {
      xmlFatalErr((xmlParserCtxtPtr)ret,XML_ERR_RESOURCE_LIMIT,"URI too long");
      return (xmlParserInputPtr)0x0;
    }
    iVar1 = xmlBuildURISafe((xmlChar *)ctxt,pxStack_48,&base);
    if (base == (xmlChar *)0x0) {
      if (iVar1 < 0) {
        xmlSAX2ErrMemory((xmlParserCtxtPtr)ret);
      }
      else {
        xmlWarnMsg((xmlParserCtxtPtr)ret,XML_ERR_INVALID_URI,"Can\'t resolve URI: %s\n",
                   (xmlChar *)ctxt);
      }
      return (xmlParserInputPtr)0x0;
    }
    iVar1 = xmlStrlen(base);
    if (2000 < iVar1) {
      xmlFatalErr((xmlParserCtxtPtr)ret,XML_ERR_RESOURCE_LIMIT,"URI too long");
      (*xmlFree)(base);
      return (xmlParserInputPtr)0x0;
    }
  }
  URI = (xmlChar *)
        xmlLoadResource((xmlParserCtxtPtr)ret,(char *)base,(char *)systemId_local,XML_RESOURCE_DTD);
  (*xmlFree)(base);
  return (xmlParserInputPtr)URI;
}

Assistant:

xmlParserInputPtr
xmlSAX2ResolveEntity(void *ctx, const xmlChar *publicId,
                     const xmlChar *systemId)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserInputPtr ret = NULL;
    xmlChar *URI = NULL;

    if (ctx == NULL) return(NULL);

    if (systemId != NULL) {
        const xmlChar *base = NULL;
        int res;

        if (ctxt->input != NULL)
            base = BAD_CAST ctxt->input->filename;

        /*
         * We don't really need the 'directory' struct member, but some
         * users set it manually to a base URI for memory streams.
         */
        if (base == NULL)
            base = BAD_CAST ctxt->directory;

        if ((xmlStrlen(systemId) > XML_MAX_URI_LENGTH) ||
            (xmlStrlen(base) > XML_MAX_URI_LENGTH)) {
            xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT, "URI too long");
            return(NULL);
        }
        res = xmlBuildURISafe(systemId, base, &URI);
        if (URI == NULL) {
            if (res < 0)
                xmlSAX2ErrMemory(ctxt);
            else
                xmlWarnMsg(ctxt, XML_ERR_INVALID_URI,
                           "Can't resolve URI: %s\n", systemId);
            return(NULL);
        }
        if (xmlStrlen(URI) > XML_MAX_URI_LENGTH) {
            xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT, "URI too long");
            xmlFree(URI);
            return(NULL);
        }
    }

    ret = xmlLoadResource(ctxt, (const char *) URI,
                          (const char *) publicId, XML_RESOURCE_DTD);

    xmlFree(URI);
    return(ret);
}